

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subsystem_netconf.c
# Opt level: O3

int main(int argc,char **argv)

{
  char *pcVar1;
  uint uVar2;
  int iVar3;
  in_addr_t iVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  size_t sVar8;
  ulong extraout_RAX;
  long lVar9;
  sockaddr_in sin;
  ssize_t len;
  char buf [1048576];
  
  if (((1 < argc) && (server_ip = argv[1], argc != 2)) && (username = argv[2], 3 < (uint)argc)) {
    password = argv[3];
  }
  uVar2 = libssh2_init(0);
  if (uVar2 == 0) {
    iVar3 = socket(2,1,6);
    if (iVar3 == -1) {
      main_cold_8();
    }
    else {
      iVar4 = inet_addr(server_ip);
      if (iVar4 == 0xffffffff) {
        main_cold_7();
      }
      else {
        iVar5 = connect(iVar3,(sockaddr *)&stack0xffffffffffefffb0,0x10);
        if (iVar5 == 0) {
          lVar6 = libssh2_session_init_ex(0,0,0,0);
          if (lVar6 == 0) {
            main_cold_6();
          }
          else {
            uVar2 = libssh2_session_handshake(lVar6,iVar3);
            if (uVar2 == 0) {
              lVar7 = libssh2_hostkey_hash(lVar6,2);
              fwrite("Fingerprint: ",0xd,1,_stderr);
              lVar9 = 0;
              do {
                fprintf(_stderr,"%02X ",(ulong)*(byte *)(lVar7 + lVar9));
                lVar9 = lVar9 + 1;
              } while (lVar9 != 0x14);
              fputc(10,_stderr);
              pcVar1 = username;
              sVar8 = strlen(username);
              lVar7 = libssh2_userauth_list(lVar6,pcVar1,sVar8 & 0xffffffff);
              if ((lVar7 == 0) || (main_cold_2(), (extraout_RAX & 1) == 0)) {
                lVar7 = libssh2_channel_open_ex(lVar6,"session",7,0x200000,0x8000,0);
                if (lVar7 == 0) {
                  main_cold_5();
                }
                else {
                  iVar5 = libssh2_channel_process_startup(lVar7,"subsystem",9,"netconf",7);
                  if (iVar5 == 0) {
                    main_cold_4();
                  }
                  else {
                    main_cold_3();
                  }
                  libssh2_channel_free(lVar7);
                }
              }
            }
            else {
              fprintf(_stderr,"Error when starting up SSH session: %d\n",(ulong)uVar2);
            }
            libssh2_session_disconnect_ex(lVar6,0xb,"Normal Shutdown","");
            libssh2_session_free(lVar6);
          }
        }
        else {
          main_cold_1();
        }
      }
      shutdown(iVar3,2);
      close(iVar3);
    }
    libssh2_exit();
    iVar3 = 0;
  }
  else {
    fprintf(_stderr,"libssh2 initialization failed (%d)\n",(ulong)uVar2);
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int main(int argc, char *argv[])
{
    int i, auth = AUTH_NONE;
    struct sockaddr_in sin;
    const char *fingerprint;
    char *userauthlist;
    int rc;
    LIBSSH2_SESSION *session = NULL;
    LIBSSH2_CHANNEL *channel = NULL;
    char buf[1048576]; /* avoid any buffer reallocation for simplicity */
    ssize_t len;
    libssh2_socket_t sock;

#ifdef WIN32
    WSADATA wsadata;

    rc = WSAStartup(MAKEWORD(2, 0), &wsadata);
    if(rc) {
        fprintf(stderr, "WSAStartup failed with error: %d\n", rc);
        return 1;
    }
#endif

    if(argc > 1)
        server_ip = argv[1];
    if(argc > 2)
        username = argv[2];
    if(argc > 3)
        password = argv[3];

    rc = libssh2_init(0);
    if(rc) {
        fprintf(stderr, "libssh2 initialization failed (%d)\n", rc);
        return 1;
    }

    /* Connect to SSH server */
    sock = socket(PF_INET, SOCK_STREAM, IPPROTO_TCP);
    if(sock == LIBSSH2_INVALID_SOCKET) {
        fprintf(stderr, "failed to open socket!\n");
        goto shutdown;
    }

    sin.sin_family = AF_INET;
    sin.sin_addr.s_addr = inet_addr(server_ip);
    if(INADDR_NONE == sin.sin_addr.s_addr) {
        fprintf(stderr, "inet_addr: Invalid IP address \"%s\"\n", server_ip);
        goto shutdown;
    }
    sin.sin_port = htons(830);
    if(connect(sock, (struct sockaddr*)(&sin), sizeof(struct sockaddr_in))) {
        fprintf(stderr, "Failed to connect to %s!\n", inet_ntoa(sin.sin_addr));
        goto shutdown;
    }

    /* Create a session instance */
    session = libssh2_session_init();
    if(!session) {
        fprintf(stderr, "Could not initialize SSH session!\n");
        goto shutdown;
    }

    /* ... start it up. This will trade welcome banners, exchange keys,
     * and setup crypto, compression, and MAC layers
     */
    rc = libssh2_session_handshake(session, sock);
    if(rc) {
        fprintf(stderr, "Error when starting up SSH session: %d\n", rc);
        goto shutdown;
    }

    /* At this point we have not yet authenticated.  The first thing to do
     * is check the hostkey's fingerprint against our known hosts Your app
     * may have it hard coded, may go to a file, may present it to the
     * user, that's your call
     */
    fingerprint = libssh2_hostkey_hash(session, LIBSSH2_HOSTKEY_HASH_SHA1);
    fprintf(stderr, "Fingerprint: ");
    for(i = 0; i < 20; i++)
        fprintf(stderr, "%02X ", (unsigned char)fingerprint[i]);
    fprintf(stderr, "\n");

    /* check what authentication methods are available */
    userauthlist = libssh2_userauth_list(session, username,
                                         (unsigned int)strlen(username));
    if(userauthlist) {
        fprintf(stderr, "Authentication methods: %s\n", userauthlist);
        if(strstr(userauthlist, "password"))
            auth |= AUTH_PASSWORD;
        if(strstr(userauthlist, "publickey"))
            auth |= AUTH_PUBLICKEY;

        /* check for options */
        if(argc > 4) {
            if((auth & AUTH_PASSWORD) && !strcmp(argv[4], "-p"))
                auth = AUTH_PASSWORD;
            if((auth & AUTH_PUBLICKEY) && !strcmp(argv[4], "-k"))
                auth = AUTH_PUBLICKEY;
        }

        if(auth & AUTH_PASSWORD) {
            if(libssh2_userauth_password(session, username, password)) {
                fprintf(stderr, "Authentication by password failed!\n");
                goto shutdown;
            }
        }
        else if(auth & AUTH_PUBLICKEY) {
            if(libssh2_userauth_publickey_fromfile(session, username,
                                                   pubkey, privkey,
                                                   password)) {
                fprintf(stderr, "Authentication by public key failed!\n");
                goto shutdown;
            }
            else {
                fprintf(stderr, "Authentication by public key succeeded.\n");
            }
        }
        else {
            fprintf(stderr, "No supported authentication methods found!\n");
            goto shutdown;
        }
    }

    /* open a channel */
    channel = libssh2_channel_open_session(session);
    if(!channel) {
        fprintf(stderr, "Could not open the channel!\n"
                        "(Note that this can be a problem at the server!"
                       " Please review the server logs.)\n");
        goto shutdown;
    }

    /* execute the subsystem on our channel */
    if(libssh2_channel_subsystem(channel, "netconf")) {
        fprintf(stderr, "Could not execute the \"netconf\" subsystem!\n"
                        "(Note that this can be a problem at the server!"
                        " Please review the server logs.)\n");
        goto shutdown;
    }

    /* NETCONF: https://tools.ietf.org/html/draft-ietf-netconf-ssh-06 */

    fprintf(stderr, "Sending NETCONF client <hello>\n");
    snprintf(buf, sizeof(buf),
      "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
      "<hello>"
      "<capabilities>"
      "<capability>urn:ietf:params:xml:ns:netconf:base:1.0</capability>"
      "</capabilities>"
      "</hello>\n"
      "]]>]]>\n%n", (int *)&len);
    if(-1 == netconf_write(channel, buf, len))
        goto shutdown;

    fprintf(stderr, "Reading NETCONF server <hello>\n");
    len = netconf_read_until(channel, "</hello>", buf, sizeof(buf));
    if(-1 == len)
        goto shutdown;

    fprintf(stderr, "Got %d bytes:\n----------------------\n%s",
            (int)len, buf);

    fprintf(stderr, "Sending NETCONF <rpc>\n");
    snprintf(buf, sizeof(buf),
      "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
      "<rpc xmlns=\"urn:ietf:params:xml:ns:netconf:base:1.0\">"
      "<get-interface-information><terse/></get-interface-information>"
      "</rpc>\n"
      "]]>]]>\n%n", (int *)&len);
    if(-1 == netconf_write(channel, buf, len))
        goto shutdown;

    fprintf(stderr, "Reading NETCONF <rpc-reply>\n");
    len = netconf_read_until(channel, "</rpc-reply>", buf, sizeof(buf));
    if(-1 == len)
        goto shutdown;

    fprintf(stderr, "Got %d bytes:\n----------------------\n%s",
            (int)len, buf);

shutdown:

    if(channel)
        libssh2_channel_free(channel);

    if(session) {
        libssh2_session_disconnect(session, "Normal Shutdown");
        libssh2_session_free(session);
    }

    if(sock != LIBSSH2_INVALID_SOCKET) {
        shutdown(sock, 2);
#ifdef WIN32
        closesocket(sock);
#else
        close(sock);
#endif
    }

    libssh2_exit();

    return 0;
}